

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::Detail::anon_unknown_0::
StreamBufImpl<Catch::Detail::(anonymous_namespace)::OutputDebugWriter,_256UL>::sync
          (StreamBufImpl<Catch::Detail::(anonymous_namespace)::OutputDebugWriter,_256UL> *this)

{
  char *local_38;
  long local_30;
  char local_28 [16];
  
  if (*(long *)&this->field_0x20 != *(long *)&this->field_0x28) {
    local_38 = local_28;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_38,local_30);
    if (local_38 != local_28) {
      operator_delete(local_38);
    }
    *(undefined8 *)&this->field_0x28 = *(undefined8 *)&this->field_0x20;
  }
  return;
}

Assistant:

T const& operator + ( T const& value, StreamEndStop ) {
        return value;
    }